

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::move_from(sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *ht,size_type min_buckets_wanted)

{
  size_type *psVar1;
  uint *puVar2;
  ushort uVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  destructive_iterator it;
  sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_c0;
  destructive_iterator local_78;
  
  clear(this);
  if (mover == MoveDontGrow) {
    uVar5 = (ht->table).settings.table_size;
  }
  else {
    uVar5 = sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                        (ht->table).settings.num_buckets - ht->num_deleted,min_buckets_wanted);
  }
  if ((this->table).settings.table_size < uVar5) {
    sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::resize(&this->table,uVar5);
    fVar10 = (float)(this->table).settings.table_size;
    fVar11 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
             enlarge_factor_ * fVar10;
    uVar5 = (ulong)fVar11;
    (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar11 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    fVar10 = fVar10 * (this->settings).
                      super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
                      shrink_factor_;
    uVar5 = (ulong)fVar10;
    (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar10 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
    consider_shrink_ = false;
  }
  destructive_begin(&local_78,ht);
  while( true ) {
    local_c0.pos.row_begin._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.pos.row_end._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0.pos.col_current = (const_reference)0x0;
    local_c0.end.col_current = (nonempty_iterator)0x0;
    local_c0.ht = ht;
    local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
    local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
    sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted(&local_c0);
    if ((((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
         (local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
        (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) &&
       ((local_78.pos.row_current._M_current == local_78.pos.row_end._M_current ||
        (local_78.pos.col_current == local_c0.pos.col_current)))) break;
    psVar4 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (this->table).settings.table_size - 1;
    uVar7 = (long)(local_78.pos.col_current)->first & uVar8;
    uVar6 = uVar7 / 0x30;
    uVar5 = uVar7 % 0x30;
    if ((psVar4[uVar6].bitmap[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) {
      lVar9 = 1;
      do {
        uVar7 = uVar7 + lVar9 & uVar8;
        uVar6 = uVar7 / 0x30;
        uVar5 = uVar7 % 0x30;
        lVar9 = lVar9 + 1;
      } while ((psVar4[uVar6].bitmap[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0);
    }
    uVar3 = psVar4[uVar6].settings.num_buckets;
    sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::set(psVar4 + uVar6,(size_type_conflict)uVar5,local_78.pos.col_current);
    psVar1 = &(this->table).settings.num_buckets;
    *psVar1 = *psVar1 + ((ulong)(this->table).groups.
                                super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6].settings.
                                num_buckets - (ulong)uVar3);
    local_78.pos.col_current = local_78.pos.col_current + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
    ::advance_past_end(&local_78.pos);
    sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted(&local_78);
  }
  puVar2 = &(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
            num_ht_copies_;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }